

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_times.c
# Opt level: O1

u_char * ngx_http_cookie_time(u_char *buf,time_t t)

{
  uint uVar1;
  u_char *puVar2;
  char *fmt;
  undefined1 local_50 [8];
  ngx_tm_t tm;
  
  ngx_gmtime(t,(ngx_tm_t *)local_50);
  fmt = "%s, %02d-%s-%02d %02d:%02d:%02d GMT";
  if (0x7f5 < tm.tm_mday) {
    fmt = "%s, %02d-%s-%d %02d:%02d:%02d GMT";
  }
  uVar1 = tm.tm_mday % 100;
  if (0x7f5 < tm.tm_mday) {
    uVar1 = tm.tm_mday;
  }
  puVar2 = ngx_sprintf(buf,fmt,week[tm.tm_mon],(ulong)(uint)tm.tm_min,
                       *(undefined8 *)(&DAT_001b9ee8 + (long)tm.tm_hour * 8),(ulong)uVar1,
                       (ulong)(uint)tm.tm_sec,(ulong)(uint)local_50._4_4_,
                       (ulong)(uint)local_50._0_4_);
  return puVar2;
}

Assistant:

u_char *
ngx_http_cookie_time(u_char *buf, time_t t)
{
    ngx_tm_t  tm;

    ngx_gmtime(t, &tm);

    /*
     * Netscape 3.x does not understand 4-digit years at all and
     * 2-digit years more than "37"
     */

    return ngx_sprintf(buf,
                       (tm.ngx_tm_year > 2037) ?
                                         "%s, %02d-%s-%d %02d:%02d:%02d GMT":
                                         "%s, %02d-%s-%02d %02d:%02d:%02d GMT",
                       week[tm.ngx_tm_wday],
                       tm.ngx_tm_mday,
                       months[tm.ngx_tm_mon - 1],
                       (tm.ngx_tm_year > 2037) ? tm.ngx_tm_year:
                                                 tm.ngx_tm_year % 100,
                       tm.ngx_tm_hour,
                       tm.ngx_tm_min,
                       tm.ngx_tm_sec);
}